

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O1

int mbedtls_ssl_check_curve_tls_id(mbedtls_ssl_context *ssl,uint16_t tls_id)

{
  uint16_t uVar1;
  uint16_t *puVar2;
  
  if ((ssl->handshake == (mbedtls_ssl_handshake_params *)0x0) ||
     (puVar2 = ssl->handshake->group_list, puVar2 == (uint16_t *)0x0)) {
    puVar2 = ssl->conf->group_list;
  }
  if (puVar2 != (uint16_t *)0x0) {
    uVar1 = *puVar2;
    while (uVar1 != 0) {
      puVar2 = puVar2 + 1;
      if (uVar1 == tls_id) {
        return 0;
      }
      uVar1 = *puVar2;
    }
  }
  return -1;
}

Assistant:

int mbedtls_ssl_check_curve_tls_id(const mbedtls_ssl_context *ssl, uint16_t tls_id)
{
    const uint16_t *group_list = mbedtls_ssl_get_groups(ssl);

    if (group_list == NULL) {
        return -1;
    }

    for (; *group_list != 0; group_list++) {
        if (*group_list == tls_id) {
            return 0;
        }
    }

    return -1;
}